

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

vector<cmsys::String,_std::allocator<cmsys::String>_> *
cmsys::SystemTools::SplitString
          (vector<cmsys::String,_std::allocator<cmsys::String>_> *__return_storage_ptr__,string *p,
          char sep,bool isPath)

{
  ulong uVar1;
  char *pcVar2;
  stl_string local_120;
  String local_100;
  stl_string local_e0;
  String local_c0;
  long local_a0;
  size_type pos2;
  size_type pos1;
  undefined8 local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined8 local_60 [3];
  undefined4 local_48;
  undefined1 local_41;
  string local_40 [8];
  string path;
  bool isPath_local;
  char sep_local;
  string *p_local;
  vector<cmsys::String,_std::allocator<cmsys::String>_> *paths;
  
  path.field_2._M_local_buf[0xe] = isPath;
  path.field_2._M_local_buf[0xf] = sep;
  std::__cxx11::string::string(local_40,(string *)p);
  local_41 = 0;
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::vector(__return_storage_ptr__);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    if (((path.field_2._M_local_buf[0xe] & 1U) != 0) &&
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar2 == '/')) {
      local_68._M_current = (char *)std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)local_60,&local_68);
      local_70 = std::__cxx11::string::erase(local_40,local_60[0]);
      String::String((String *)&pos1,"/");
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::push_back
                (__return_storage_ptr__,(value_type *)&pos1);
      String::~String((String *)&pos1);
    }
    pos2 = 0;
    local_a0 = std::__cxx11::string::find
                         ((char)local_40,(ulong)(uint)(int)path.field_2._M_local_buf[0xf]);
    while (local_a0 != -1) {
      std::__cxx11::string::substr((ulong)&local_e0,(ulong)local_40);
      String::String(&local_c0,&local_e0,0,0xffffffffffffffff);
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::push_back
                (__return_storage_ptr__,&local_c0);
      String::~String(&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      pos2 = local_a0 + 1;
      local_a0 = std::__cxx11::string::find
                           ((char)local_40,(ulong)(uint)(int)path.field_2._M_local_buf[0xf]);
    }
    std::__cxx11::string::substr((ulong)&local_120,(ulong)local_40);
    String::String(&local_100,&local_120,0,0xffffffffffffffff);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::push_back
              (__return_storage_ptr__,&local_100);
    String::~String(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  local_41 = 1;
  local_48 = 1;
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::vector<kwsys::String> SystemTools::SplitString(const kwsys_stl::string& p, char sep, bool isPath)
{
  kwsys_stl::string path = p;
  kwsys_stl::vector<kwsys::String> paths;
  if(path.empty())
    {
    return paths;
    }
  if(isPath && path[0] == '/')
    {
    path.erase(path.begin());
    paths.push_back("/");
    }
  kwsys_stl::string::size_type pos1 = 0;
  kwsys_stl::string::size_type pos2 = path.find(sep, pos1+1);
  while(pos2 != kwsys_stl::string::npos)
    {
    paths.push_back(path.substr(pos1, pos2-pos1));
    pos1 = pos2+1;
    pos2 = path.find(sep, pos1+1);
    }
  paths.push_back(path.substr(pos1, pos2-pos1));

  return paths;
}